

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void VP8LTransformColor_C(VP8LMultipliers *m,uint32_t *data,int num_pixels)

{
  uint uVar1;
  int8_t color;
  byte color_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_EDX;
  long in_RSI;
  int8_t *in_RDI;
  int new_blue;
  int new_red;
  int8_t red;
  int8_t green;
  uint32_t argb;
  int i;
  int local_18;
  
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    uVar1 = *(uint *)(in_RSI + (long)local_18 * 4);
    color = U32ToS8(uVar1 >> 8);
    color_00 = U32ToS8(uVar1 >> 0x10);
    iVar2 = ColorTransformDelta(*in_RDI,color);
    iVar3 = ColorTransformDelta(in_RDI[1],color);
    iVar4 = ColorTransformDelta(in_RDI[2],color_00);
    *(uint *)(in_RSI + (long)local_18 * 4) =
         uVar1 & 0xff00ff00 | ((uint)color_00 - iVar2 & 0xff) << 0x10 |
         ((uVar1 & 0xff) - iVar3) - iVar4 & 0xff;
  }
  return;
}

Assistant:

void VP8LTransformColor_C(const VP8LMultipliers* const m, uint32_t* data,
                          int num_pixels) {
  int i;
  for (i = 0; i < num_pixels; ++i) {
    const uint32_t argb = data[i];
    const int8_t green = U32ToS8(argb >>  8);
    const int8_t red   = U32ToS8(argb >> 16);
    int new_red = red & 0xff;
    int new_blue = argb & 0xff;
    new_red -= ColorTransformDelta(m->green_to_red_, green);
    new_red &= 0xff;
    new_blue -= ColorTransformDelta(m->green_to_blue_, green);
    new_blue -= ColorTransformDelta(m->red_to_blue_, red);
    new_blue &= 0xff;
    data[i] = (argb & 0xff00ff00u) | (new_red << 16) | (new_blue);
  }
}